

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

void __thiscall duckdb::SetCommentInfo::SetCommentInfo(SetCommentInfo *this)

{
  LogicalType LStack_28;
  
  AlterInfo::AlterInfo(&this->super_AlterInfo,SET_COMMENT);
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__SetCommentInfo_027afa60;
  LogicalType::LogicalType(&LStack_28,SQLNULL);
  Value::Value(&this->comment_value,&LStack_28);
  LogicalType::~LogicalType(&LStack_28);
  return;
}

Assistant:

SetCommentInfo::SetCommentInfo() : AlterInfo(AlterType::SET_COMMENT) {
}